

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O1

int enet_protocol_handle_send_unreliable_fragment
              (ENetHost *host,ENetPeer *peer,ENetProtocol *command,enet_uint8 **currentData)

{
  uint *puVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  ushort uVar5;
  enet_uint8 *peVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  ushort uVar10;
  ENetIncomingCommand *pEVar11;
  uint uVar12;
  char cVar13;
  uint uVar14;
  ENetChannel *channel;
  bool bVar15;
  ENetIncomingCommand *local_40;
  
  if (((ulong)(command->header).channelID < peer->channelCount) &&
     (peer->state - ENET_PEER_STATE_CONNECTED < 2)) {
    uVar2 = (command->acknowledge).receivedSentTime;
    uVar5 = uVar2 << 8 | uVar2 >> 8;
    peVar6 = *currentData + uVar5;
    *currentData = peVar6;
    if ((uVar2 != 0) &&
       ((((ulong)uVar5 <= host->maximumPacketSize && (host->receivedData <= peVar6)) &&
        (peVar6 <= host->receivedData + host->receivedDataLength)))) {
      uVar8 = (ulong)((uint)(command->header).channelID * 0x50);
      uVar2 = (command->header).reliableSequenceNumber;
      uVar3 = *(ushort *)((long)peer->channels->reliableWindows + uVar8 + 0x20);
      uVar10 = (uVar2 >> 0xc) + 0x10;
      if (uVar3 <= uVar2) {
        uVar10 = uVar2 >> 0xc;
      }
      if ((ushort)((uVar3 >> 0xc) + 7) <= uVar10 || uVar10 < uVar3 >> 0xc) {
        return 0;
      }
      channel = (ENetChannel *)((long)peer->channels->reliableWindows + (uVar8 - 6));
      uVar10 = (command->acknowledge).receivedReliableSequenceNumber << 8 |
               (command->acknowledge).receivedReliableSequenceNumber >> 8;
      if ((uVar2 == uVar3) && (uVar10 <= channel->incomingUnreliableSequenceNumber)) {
        return 0;
      }
      uVar12 = (command->connect).mtu;
      uVar4 = (command->connect).windowSize;
      uVar9 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
      uVar12 = uVar12 >> 0x18 | (uVar12 & 0xff0000) >> 8 | (uVar12 & 0xff00) << 8 | uVar12 << 0x18;
      if (uVar9 < uVar12 && uVar12 < 0x100001) {
        uVar7 = (command->connect).incomingBandwidth;
        uVar14 = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
        uVar7 = (command->connect).channelCount;
        uVar7 = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
        uVar8 = (ulong)uVar7;
        if ((((uint)uVar5 <= uVar7 - uVar14) && (uVar14 < uVar7)) &&
           ((uVar12 <= uVar7 && (uVar8 <= host->maximumPacketSize)))) {
          pEVar11 = (ENetIncomingCommand *)(channel->incomingUnreliableCommands).sentinel.previous;
          if (pEVar11 == (ENetIncomingCommand *)&channel->incomingUnreliableCommands) {
            local_40 = (ENetIncomingCommand *)0x0;
          }
          else {
            local_40 = (ENetIncomingCommand *)0x0;
            do {
              if (uVar2 < uVar3) {
                cVar13 = '\x02';
                if (pEVar11->reliableSequenceNumber < uVar3) {
LAB_00108a70:
                  cVar13 = '\x02';
                  if (uVar2 <= pEVar11->reliableSequenceNumber) {
                    if (uVar2 < pEVar11->reliableSequenceNumber) {
                      cVar13 = '\x04';
                    }
                    else if (uVar10 < pEVar11->unreliableSequenceNumber) {
                      cVar13 = '\0';
                    }
                    else if (((uVar10 <= pEVar11->unreliableSequenceNumber) &&
                             (cVar13 = '\x01', ((pEVar11->command).header.command & 0xf) == 0xc)) &&
                            (pEVar11->packet->dataLength == uVar8)) {
                      bVar15 = uVar12 == pEVar11->fragmentCount;
                      if (bVar15) {
                        local_40 = pEVar11;
                      }
                      cVar13 = bVar15 + '\x01';
                    }
                  }
                }
              }
              else {
                cVar13 = '\x04';
                if (uVar3 <= pEVar11->reliableSequenceNumber) goto LAB_00108a70;
              }
              if ((cVar13 != '\0') && (cVar13 != '\x04')) {
                if (cVar13 != '\x02') {
                  return -1;
                }
                break;
              }
              pEVar11 = (ENetIncomingCommand *)(pEVar11->incomingCommandList).previous;
            } while (pEVar11 != (ENetIncomingCommand *)&channel->incomingUnreliableCommands);
          }
          if ((local_40 == (ENetIncomingCommand *)0x0) &&
             (local_40 = enet_peer_queue_incoming_command(peer,command,(void *)0x0,uVar8,8,uVar12),
             local_40 == (ENetIncomingCommand *)0x0)) {
            return -1;
          }
          uVar9 = uVar9 >> 5;
          if ((local_40->fragments[uVar9] >> (uVar4 >> 0x18 & 0x1f) & 1) != 0) {
            return 0;
          }
          local_40->fragmentsRemaining = local_40->fragmentsRemaining - 1;
          puVar1 = local_40->fragments + uVar9;
          *puVar1 = *puVar1 | 1 << ((byte)(uVar4 >> 0x18) & 0x1f);
          uVar8 = local_40->packet->dataLength;
          uVar12 = (int)uVar8 - uVar14;
          if (uVar14 + uVar5 <= uVar8) {
            uVar12 = (uint)uVar5;
          }
          memcpy(local_40->packet->data + uVar14,&(command->connect).outgoingBandwidth,(ulong)uVar12
                );
          if (local_40->fragmentsRemaining == 0) {
            enet_peer_dispatch_incoming_unreliable_commands(peer,channel,(ENetIncomingCommand *)0x0)
            ;
            return 0;
          }
          return 0;
        }
      }
    }
  }
  return -1;
}

Assistant:

static int enet_protocol_handle_send_unreliable_fragment(ENetHost *host, ENetPeer *peer, const ENetProtocol *command, enet_uint8 **currentData) {
        enet_uint32 fragmentNumber, fragmentCount, fragmentOffset, fragmentLength, reliableSequenceNumber, startSequenceNumber, totalLength;
        enet_uint16 reliableWindow, currentWindow;
        ENetChannel *channel;
        ENetListIterator currentCommand;
        ENetIncomingCommand *startCommand = NULL;

        if (command->header.channelID >= peer->channelCount || (peer->state != ENET_PEER_STATE_CONNECTED && peer->state != ENET_PEER_STATE_DISCONNECT_LATER)) {
            return -1;
        }

        fragmentLength = ENET_NET_TO_HOST_16(command->sendFragment.dataLength);
        *currentData  += fragmentLength;
        if (fragmentLength <= 0 ||
            fragmentLength > host->maximumPacketSize ||
            *currentData < host->receivedData ||
            *currentData > &host->receivedData[host->receivedDataLength]
        ) {
            return -1;
        }

        channel = &peer->channels[command->header.channelID];
        reliableSequenceNumber = command->header.reliableSequenceNumber;
        startSequenceNumber    = ENET_NET_TO_HOST_16(command->sendFragment.startSequenceNumber);

        reliableWindow = reliableSequenceNumber / ENET_PEER_RELIABLE_WINDOW_SIZE;
        currentWindow  = channel->incomingReliableSequenceNumber / ENET_PEER_RELIABLE_WINDOW_SIZE;

        if (reliableSequenceNumber < channel->incomingReliableSequenceNumber) {
            reliableWindow += ENET_PEER_RELIABLE_WINDOWS;
        }

        if (reliableWindow < currentWindow || reliableWindow >= currentWindow + ENET_PEER_FREE_RELIABLE_WINDOWS - 1) {
            return 0;
        }

        if (reliableSequenceNumber == channel->incomingReliableSequenceNumber && startSequenceNumber <= channel->incomingUnreliableSequenceNumber) {
            return 0;
        }

        fragmentNumber = ENET_NET_TO_HOST_32(command->sendFragment.fragmentNumber);
        fragmentCount  = ENET_NET_TO_HOST_32(command->sendFragment.fragmentCount);
        fragmentOffset = ENET_NET_TO_HOST_32(command->sendFragment.fragmentOffset);
        totalLength    = ENET_NET_TO_HOST_32(command->sendFragment.totalLength);

        if (fragmentCount > ENET_PROTOCOL_MAXIMUM_FRAGMENT_COUNT ||
            fragmentNumber >= fragmentCount ||
            totalLength > host->maximumPacketSize ||
            totalLength < fragmentCount ||
            fragmentOffset >= totalLength ||
            fragmentLength > totalLength - fragmentOffset
        ) {
            return -1;
        }

        for (currentCommand = enet_list_previous(enet_list_end(&channel->incomingUnreliableCommands));
            currentCommand != enet_list_end(&channel->incomingUnreliableCommands);
            currentCommand = enet_list_previous(currentCommand)
        ) {
            ENetIncomingCommand *incomingCommand = (ENetIncomingCommand *) currentCommand;

            if (reliableSequenceNumber >= channel->incomingReliableSequenceNumber) {
                if (incomingCommand->reliableSequenceNumber < channel->incomingReliableSequenceNumber) {
                    continue;
                }
            } else if (incomingCommand->reliableSequenceNumber >= channel->incomingReliableSequenceNumber) {
                break;
            }

            if (incomingCommand->reliableSequenceNumber < reliableSequenceNumber) {
                break;
            }

            if (incomingCommand->reliableSequenceNumber > reliableSequenceNumber) {
                continue;
            }

            if (incomingCommand->unreliableSequenceNumber <= startSequenceNumber) {
                if (incomingCommand->unreliableSequenceNumber < startSequenceNumber) {
                    break;
                }

                if ((incomingCommand->command.header.command & ENET_PROTOCOL_COMMAND_MASK) !=
                    ENET_PROTOCOL_COMMAND_SEND_UNRELIABLE_FRAGMENT ||
                    totalLength != incomingCommand->packet->dataLength ||
                    fragmentCount != incomingCommand->fragmentCount
                ) {
                    return -1;
                }

                startCommand = incomingCommand;
                break;
            }
        }

        if (startCommand == NULL) {
            startCommand = enet_peer_queue_incoming_command(peer, command, NULL, totalLength,
                ENET_PACKET_FLAG_UNRELIABLE_FRAGMENT, fragmentCount);
            if (startCommand == NULL) {
                return -1;
            }
        }

        if ((startCommand->fragments[fragmentNumber / 32] & (1u << (fragmentNumber % 32))) == 0) {
            --startCommand->fragmentsRemaining;
            startCommand->fragments[fragmentNumber / 32] |= (1u << (fragmentNumber % 32));

            if (fragmentOffset + fragmentLength > startCommand->packet->dataLength) {
                fragmentLength = startCommand->packet->dataLength - fragmentOffset;
            }

            memcpy(startCommand->packet->data + fragmentOffset, (enet_uint8 *) command + sizeof(ENetProtocolSendFragment), fragmentLength);

            if (startCommand->fragmentsRemaining <= 0) {
                enet_peer_dispatch_incoming_unreliable_commands(peer, channel, NULL);
            }
        }

        return 0;
    }